

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O2

int SetBaseCfgublox(UBLOX *publox)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  long lVar3;
  double dVar4;
  int packetlen;
  uchar local_310 [40];
  uchar sendbuf [512];
  uchar local_e8 [2];
  ushort uStack_e6;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  undefined8 local_c8;
  uchar packet [128];
  
  packetlen = 0;
  local_310[0] = 0xf5;
  local_310[1] = '\x05';
  local_310[2] = '\0';
  local_310[3] = '\x01';
  local_310[4] = '\0';
  local_310[5] = '\x01';
  local_310[6] = '\0';
  local_310[7] = '\0';
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf,packet,sVar2);
  local_310[1] = 0x4d;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  __n = (size_t)packetlen;
  memcpy(sendbuf + sVar2,packet,__n);
  lVar3 = __n + sVar2;
  local_310[1] = 0x57;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 0x61;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 0x7f;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 0xe6;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 0xfe;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[0] = 0xf0;
  local_310[1] = '\0';
  local_310[2] = '\0';
  local_310[3] = '\0';
  local_310[4] = '\0';
  local_310[5] = '\0';
  local_310[6] = '\0';
  local_310[7] = '\0';
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 1;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 2;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 3;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 4;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 5;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 7;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 8;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[1] = 0xd;
  EncodePacketUBX(packet,&packetlen,6,1,local_310,8);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  lVar3 = (long)(int)lVar3 + sVar2;
  local_310[0x18] = '\0';
  local_310[0x19] = '\0';
  local_310[0x1a] = '\0';
  local_310[0x1b] = '\0';
  local_310[8] = '\0';
  local_310[9] = '#';
  local_310[10] = '\0';
  local_310[0xb] = '\n';
  local_310[0xc] = '\0';
  local_310[0xd] = '\0';
  local_310[0xe] = '\0';
  local_310[0xf] = '\0';
  local_310[0x10] = '\0';
  local_310[0x11] = '\0';
  local_310[0x12] = '\0';
  local_310[0x13] = '\x01';
  local_310[0x14] = '\0';
  local_310[0x15] = '\0';
  local_310[0x16] = '\0';
  local_310[0x17] = '\0';
  EncodePacketUBX(packet,&packetlen,6,0x17,local_310 + 8,0x14);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  local_e8[0] = '\0';
  local_e8[1] = '\0';
  local_c8 = 0;
  uStack_e6 = (byte)publox->SurveyMode | 0x100;
  iStack_e4 = (int)(publox->fixedLat * 10000000.0);
  iStack_e0 = (int)(publox->fixedLon * 10000000.0);
  dVar4 = publox->fixedAlt * 100.0;
  iStack_dc = (int)dVar4;
  local_d8 = (uint)CONCAT12((char)(int)((dVar4 - (double)(int)dVar4) * 100.0),
                            CONCAT11((char)(int)((publox->fixedLon * 10000000.0 - (double)iStack_e0)
                                                * 100.0),
                                     (char)(int)((publox->fixedLat * 10000000.0 - (double)iStack_e4)
                                                * 100.0)));
  _local_d8 = CONCAT44((int)(long)(publox->fixedPosAcc * 10000.0),local_d8);
  lVar3 = (long)(int)lVar3 + sVar2;
  uStack_d0 = CONCAT44((int)(long)(publox->svinAccLimit * 10000.0),(int)(long)publox->svinMinDur);
  EncodePacketUBX(packet,&packetlen,6,0x71,local_e8,0x28);
  sVar2 = (size_t)packetlen;
  memcpy(sendbuf + lVar3,packet,sVar2);
  sVar2 = (long)(int)lVar3 + sVar2;
  iVar1 = WriteAllRS232Port(&publox->RS232Port,sendbuf,(int)sVar2);
  if (iVar1 == 0) {
    iVar1 = 0;
    if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,sVar2,1,(FILE *)publox->pfSaveFile);
      fflush((FILE *)publox->pfSaveFile);
    }
  }
  else {
    puts("Error writing data to a ublox. ");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int SetBaseCfgublox(UBLOX* publox)
{
	unsigned char sendbuf[512];
	int sendbuflen = 0;
	int offset = 0;
	unsigned char packet[128];
	int packetlen = 0;
	unsigned char cfg_msg_pl[8];
	struct CFG_NMEA_PL_UBX cfg_nmea_pl;
	struct CFG_TMODE3_PL_UBX cfg_tmode3_pl;

	// Enable 1005, 1077, 1087, 1127 RTCM messages on UART1 and USB.
	memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	cfg_msg_pl[0] = RTCM_CLASS_UBX;
	cfg_msg_pl[1] = RTCM_1005_ID_UBX;
	cfg_msg_pl[3] = 1; // UART1 rate.
	cfg_msg_pl[5] = 1; // USB rate.
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1077_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1087_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1097_ID_UBX; // Not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1127_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1230_ID_UBX; // Not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_4072_0_ID_UBX; // For moving base, not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	// Disable GGA, GLL, GSA, GSV, RMC, VTG, GST, ZDA, GNS NMEA messages.
	memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	cfg_msg_pl[0] = NMEA_STD_CLASS_UBX;
	cfg_msg_pl[1] = NMEA_STD_GGA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GLL_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GSA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GSV_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_RMC_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_VTG_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GST_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_ZDA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GNS_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	//cfg_msg_pl[1] = NMEA_STD_TXT_ID_UBX;
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	////EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	//memcpy(sendbuf+offset, packet, packetlen);
	//offset += packetlen;

	// Set NMEA high precision mode.
	memset(&cfg_nmea_pl, 0, sizeof(cfg_nmea_pl));
	cfg_nmea_pl.nmeaVersion = NMEA_VERSION_2_3_UBX;
	cfg_nmea_pl.flags.consider = 1;
	cfg_nmea_pl.flags.highPrec = 1;
	cfg_nmea_pl.version = 1;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, LEN_CFG_NMEA_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, sizeof(cfg_nmea_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;

	//UBX-CFG-PORT set RTCM 3 as Output Protocol...

	// Activate Self-Survey-In or Fixed-Position-Mode.
	memset(&cfg_tmode3_pl, 0, sizeof(cfg_tmode3_pl));
	cfg_tmode3_pl.flags.lla = 1;
	cfg_tmode3_pl.flags.mode = (unsigned short)publox->SurveyMode;
	cfg_tmode3_pl.ecefXOrLat = (int)(publox->fixedLat*10000000);
	cfg_tmode3_pl.ecefYOrLon = (int)(publox->fixedLon*10000000);
	cfg_tmode3_pl.ecefZOrAlt = (int)(publox->fixedAlt*100);
	cfg_tmode3_pl.ecefXOrLatHP = (char)((publox->fixedLat*10000000-cfg_tmode3_pl.ecefXOrLat)*100);
	cfg_tmode3_pl.ecefYOrLonHP = (char)((publox->fixedLon*10000000-cfg_tmode3_pl.ecefYOrLon)*100);
	cfg_tmode3_pl.ecefZOrAltHP = (char)((publox->fixedAlt*100-cfg_tmode3_pl.ecefZOrAlt)*100);
	cfg_tmode3_pl.fixedPosAcc = (unsigned int)(publox->fixedPosAcc*10000);
	cfg_tmode3_pl.svinMinDur = (unsigned int)publox->svinMinDur;
	cfg_tmode3_pl.svinAccLimit = (unsigned int)(publox->svinAccLimit*10000);
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_TMODE3_ID_UBX, (unsigned char*)&cfg_tmode3_pl, LEN_CFG_TMODE3_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_TMODE3_ID_UBX, (unsigned char*)&cfg_tmode3_pl, sizeof(cfg_tmode3_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	
	sendbuflen = offset;

	if (WriteAllRS232Port(&publox->RS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	// Should check ACK...

	return EXIT_SUCCESS;
}